

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
make_input_array(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int N)

{
  uint uVar1;
  pointer pfVar2;
  ulong uVar3;
  result_type_conflict1 rVar4;
  random_device rd;
  mt19937 gen;
  allocator_type local_2741;
  param_type local_2740;
  random_device local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b0;
  
  std::random_device::random_device(&local_2738);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b0,(ulong)uVar1);
  local_2740._M_a = -1.0;
  local_2740._M_b = 1.0;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,(long)N,&local_2741);
  pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(__return_storage_ptr__->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar2 >> 2);
      uVar3 = uVar3 + 1) {
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_2740,&local_13b0);
    pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2[uVar3] = rVar4;
  }
  std::random_device::~random_device(&local_2738);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> make_input_array(int N) {
  std::random_device rd;
  std::mt19937 gen(rd());
  std::uniform_real_distribution<float> dis(-1.0f, 1.0f);

  std::vector<float> vf(N);
  for (size_t i = 0; i < vf.size(); ++i) {
    vf[i] = dis(gen);
  }

  return vf;
}